

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

uint32_t vkb::detail::get_separate_queue_index
                   (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    *families,VkQueueFlags desired_flags,VkQueueFlags undesired_flags)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pVVar4;
  ulong uVar5;
  
  pVVar4 = (families->
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(families->
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 3) *
          -0x5555555555555555;
  if ((int)uVar2 == 0) {
    return 0xffffffff;
  }
  uVar3 = 0xffffffff;
  uVar5 = 0;
  do {
    uVar1 = pVVar4->queueFlags;
    if ((uVar1 & 1) == 0 && (desired_flags & ~uVar1) == 0) {
      if ((uVar1 & undesired_flags) == 0) {
        return (uint32_t)uVar5;
      }
      uVar3 = uVar5 & 0xffffffff;
    }
    uVar5 = uVar5 + 1;
    pVVar4 = pVVar4 + 1;
  } while ((uVar2 & 0xffffffff) != uVar5);
  return (uint32_t)uVar3;
}

Assistant:

uint32_t get_separate_queue_index(
    std::vector<VkQueueFamilyProperties> const& families, VkQueueFlags desired_flags, VkQueueFlags undesired_flags) {
    uint32_t index = QUEUE_INDEX_MAX_VALUE;
    for (uint32_t i = 0; i < static_cast<uint32_t>(families.size()); i++) {
        if ((families[i].queueFlags & desired_flags) == desired_flags && ((families[i].queueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)) {
            if ((families[i].queueFlags & undesired_flags) == 0) {
                return i;
            } else {
                index = i;
            }
        }
    }
    return index;
}